

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O3

int mult_argument(char *argument,char *arg)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = argument + 1;
  do {
    if (pcVar2[-1] == '\0') {
      iVar1 = 1;
LAB_002a6cdc:
      strcpy(arg,argument);
      return iVar1;
    }
    if (pcVar2[-1] == '*') {
      pcVar2[-1] = '\0';
      iVar1 = atoi(argument);
      pcVar2[-1] = '*';
      argument = pcVar2;
      goto LAB_002a6cdc;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

int mult_argument(char *argument, char *arg)
{
	char *pdot;
	int number;

	for (pdot = argument; *pdot != '\0'; pdot++)
	{
		if (*pdot == '*')
		{
			*pdot = '\0';
			number = atoi(argument);
			*pdot = '*';

			strcpy(arg, pdot + 1);
			return number;
		}
	}

	strcpy(arg, argument);
	return 1;
}